

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFPageObjectHelper::forEachXObject
          (QPDFPageObjectHelper *this,bool recursive,
          function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *action,function<bool_(QPDFObjectHandle)> *selector)

{
  bool bVar1;
  bool bVar2;
  reference name;
  reference __in;
  type *__args_2;
  bool local_20a;
  uint local_1c4;
  QPDFObjectHandle local_190;
  undefined1 local_180 [8];
  QPDFObjectHandle obj;
  type *value;
  type *key;
  _Self local_158;
  iterator __end3;
  iterator __begin3;
  Dictionary *__range3;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [32];
  undefined1 local_e0 [24];
  QPDFObjectHandle xobj_dict;
  value_type *ph;
  list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> queue;
  set seen;
  QPDFObjectHelper local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  function<bool_(QPDFObjectHandle)> *selector_local;
  function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *action_local;
  QPDFPageObjectHelper *pQStack_10;
  bool recursive_local;
  QPDFPageObjectHelper *this_local;
  
  local_60.oh_.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  bVar2 = false;
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)selector;
  selector_local = (function<bool_(QPDFObjectHandle)> *)action;
  action_local._7_1_ = recursive;
  pQStack_10 = this;
  if (recursive) {
    QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffc8);
    local_60.oh_.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = 1;
    bVar1 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&stack0xffffffffffffffc8);
    local_1c4 = (uint)!bVar1;
  }
  else {
    QPDFObjectHelper::oh(&local_60);
    bVar2 = true;
    bVar1 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&local_60);
    local_1c4 = 3;
    if (bVar1) {
      local_1c4 = 2;
    }
  }
  QTC::TC("qpdf","QPDFPageObjectHelper::forEachXObject",local_1c4);
  if (bVar2) {
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_60);
  }
  if ((local_60.oh_.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffc8);
  }
  QPDFObjGen::set::set
            ((set *)&queue.
                     super__List_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                     _M_impl._M_node._M_size);
  std::__cxx11::list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::list
            ((list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&ph);
  std::__cxx11::list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>::
  emplace_back<QPDFPageObjectHelper&>
            ((list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>> *)&ph,this);
  while (bVar2 = std::__cxx11::list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::
                 empty((list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&ph),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    name = std::__cxx11::list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::front
                     ((list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&ph);
    xobj_dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                   (&(name->super_QPDFObjectHelper).super_BaseHandle);
    bVar2 = QPDFObjGen::set::add
                      ((set *)&queue.
                               super__List_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                               ._M_impl._M_node._M_size,
                       (QPDFObjGen)
                       xobj_dict.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_100,"/Resources",&local_101);
      getAttribute((QPDFPageObjectHelper *)local_e0,(string *)name,false);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_128,"/XObject",(allocator<char> *)((long)&__range3 + 7));
      QPDFObjectHandle::getKeyIfDict((QPDFObjectHandle *)(local_e0 + 0x10),(string *)local_e0);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e0);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator(&local_101);
      QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin3,(char)local_e0 + 0x10);
      __end3 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin3);
      local_158._M_node =
           (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin3);
      while (bVar2 = std::operator!=(&__end3,&local_158), bVar2) {
        __in = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
               ::operator*(&__end3);
        __args_2 = std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>(__in);
        obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>(__in);
        bVar2 = ::qpdf::BaseHandle::null
                          ((BaseHandle *)
                           obj.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
        if (!bVar2) {
          QPDFObjectHandle::QPDFObjectHandle
                    ((QPDFObjectHandle *)local_180,
                     (QPDFObjectHandle *)
                     obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
          bVar2 = std::function::operator_cast_to_bool((function *)selector);
          local_20a = true;
          if (bVar2) {
            QPDFObjectHandle::QPDFObjectHandle(&local_190,(QPDFObjectHandle *)local_180);
            local_20a = std::function<bool_(QPDFObjectHandle)>::operator()(selector,&local_190);
            QPDFObjectHandle::~QPDFObjectHandle(&local_190);
          }
          if (local_20a != false) {
            std::
            function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(action,(QPDFObjectHandle *)local_180,(QPDFObjectHandle *)(local_e0 + 0x10),
                         __args_2);
          }
          if (((action_local._7_1_ & 1) != 0) &&
             (bVar2 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)local_180), bVar2)) {
            std::__cxx11::list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>::
            emplace_back<QPDFObjectHandle&>
                      ((list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>> *)&ph,
                       (QPDFObjectHandle *)local_180);
          }
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_180);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
        ::operator++(&__end3);
      }
      ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin3);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_e0 + 0x10));
    }
    std::__cxx11::list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::pop_front
              ((list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&ph);
  }
  std::__cxx11::list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~list
            ((list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&ph);
  QPDFObjGen::set::~set
            ((set *)&queue.
                     super__List_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                     _M_impl._M_node._M_size);
  return;
}

Assistant:

void
QPDFPageObjectHelper::forEachXObject(
    bool recursive,
    std::function<void(QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key)>
        action,
    std::function<bool(QPDFObjectHandle)> selector)
{
    QTC::TC(
        "qpdf",
        "QPDFPageObjectHelper::forEachXObject",
        recursive ? (oh().isFormXObject() ? 0 : 1) : (oh().isFormXObject() ? 2 : 3));
    QPDFObjGen::set seen;
    std::list<QPDFPageObjectHelper> queue;
    queue.emplace_back(*this);
    while (!queue.empty()) {
        auto& ph = queue.front();
        if (seen.add(ph)) {
            auto xobj_dict = ph.getAttribute("/Resources", false).getKeyIfDict("/XObject");
            for (auto const& [key, value]: xobj_dict.as_dictionary()) {
                if (value.null()) {
                    continue;
                }
                auto obj = value;
                if ((!selector) || selector(obj)) {
                    action(obj, xobj_dict, key);
                }
                if (recursive && obj.isFormXObject()) {
                    queue.emplace_back(obj);
                }
            }
        }
        queue.pop_front();
    }
}